

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O2

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>
::Container::Container
          (Container *this,int d,AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *c)

{
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> AStack_1f8;
  
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint(&AStack_1f8,c);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
            ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *)this,&AStack_1f8);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint(&AStack_1f8);
  this->depth_ = d;
  (this->ctx_redef_).value_ = CTX_NONE;
  *(undefined4 *)((long)&(this->ctx_redef_).value_ + 3) = 0;
  return;
}

Assistant:

Container(int d, Constraint&& c) noexcept
      : con_(std::move(c)), depth_(d) { }